

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

ExecutionMode __thiscall
Js::FunctionExecutionStateMachine::StateToMode
          (FunctionExecutionStateMachine *this,ExecutionState state)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ExecutionState state_local;
  FunctionExecutionStateMachine *this_local;
  
  switch(state) {
  case AutoProfilingInterpreter0:
  case AutoProfilingInterpreter1:
    this_local._7_1_ = AutoProfilingInterpreter;
    break;
  case ProfilingInterpreter0:
  case ProfilingInterpreter1:
    this_local._7_1_ = ProfilingInterpreter;
    break;
  case SimpleJit:
    this_local._7_1_ = SimpleJit;
    break;
  case FullJit:
    this_local._7_1_ = FullJit;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x1da,"(!\"Unexpected ExecutionState for ExecutionMode\")",
                                "!\"Unexpected ExecutionState for ExecutionMode\"");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  case Interpreter:
    this_local._7_1_ = Interpreter;
  }
  return this_local._7_1_;
}

Assistant:

ExecutionMode  FunctionExecutionStateMachine::StateToMode(ExecutionState state) const
    {
        switch (state)
        {
        case ExecutionState::AutoProfilingInterpreter0:
        case ExecutionState::AutoProfilingInterpreter1:
            return ExecutionMode::AutoProfilingInterpreter;

        case ExecutionState::ProfilingInterpreter0:
        case ExecutionState::ProfilingInterpreter1:
            return ExecutionMode::ProfilingInterpreter;

        case ExecutionState::SimpleJit:
            return ExecutionMode::SimpleJit;

        case ExecutionState::FullJit:
            return ExecutionMode::FullJit;

        default:
            Assert(!"Unexpected ExecutionState for ExecutionMode");
            // fall through
        case ExecutionState::Interpreter:
            return ExecutionMode::Interpreter;
        }
    }